

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void kratos::sort_stmts(Generator *top)

{
  undefined1 local_58 [8];
  SortStmtVisitor visitor;
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_58 = (undefined1  [8])&PTR_visit_root_002af568;
  IRVisitor::visit_generator_root_p((IRVisitor *)local_58,top);
  IRVisitor::~IRVisitor((IRVisitor *)local_58);
  return;
}

Assistant:

void sort_stmts(Generator* top) {
    SortStmtVisitor visitor;
    visitor.visit_generator_root_p(top);
}